

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseFloatLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *this)

{
  bool bVar1;
  UnicodeChar UVar2;
  UnicodeChar UVar3;
  TokenType TVar4;
  int iVar5;
  UTF8Reader UVar6;
  double dVar7;
  UTF8Reader t;
  string local_48;
  
  t.data = (this->input).data;
  iVar5 = -1;
  while (UVar6.data = t.data, (byte)(*t.data - 0x30U) < 10) {
    UTF8Reader::operator++(&t);
    iVar5 = iVar5 + 1;
  }
  UVar2 = UTF8Reader::operator*(&t);
  if (UVar2 == 0x2e) {
    do {
      UTF8Reader::operator++(&t);
      iVar5 = iVar5 + 1;
      UVar6 = t;
    } while ((byte)(*t.data - 0x30U) < 10);
  }
  else {
    iVar5 = iVar5 + 1;
  }
  if (iVar5 == 0) {
LAB_00225fd4:
    bVar1 = false;
  }
  else {
    UVar3 = UTF8Reader::operator*(&t);
    if ((UVar3 & 0xffffffdf) == 0x45) {
      UTF8Reader::operator++(&t);
      UVar2 = UTF8Reader::operator*(&t);
      if ((UVar2 == 0x2d) || (UVar2 == 0x2b)) {
        UTF8Reader::operator++(&t);
      }
      if (9 < (byte)(*t.data - 0x30U)) goto LAB_00225fd4;
      do {
        UTF8Reader::operator++(&t);
        UVar6 = t;
      } while ((byte)(*t.data - 0x30U) < 10);
    }
    else if (UVar2 != 0x2e) goto LAB_00225fd4;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,(this->input).data,UVar6.data);
    dVar7 = std::__cxx11::stod(&local_48,(size_t *)0x0);
    this->literalDoubleValue = dVar7;
    std::__cxx11::string::~string((string *)&local_48);
    (this->input).data = t.data;
    TVar4 = parseSuffixForFloatLiteral(this);
    (this->literalType).text = TVar4.text;
    checkCharacterImmediatelyAfterLiteral(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool parseFloatLiteral()
    {
        int numDigits = 0;
        auto t = input;
        while (t.isDigit())  { ++t; ++numDigits; }

        const bool hasPoint = (*t == '.');

        if (hasPoint)
            while ((++t).isDigit())  ++numDigits;

        if (numDigits == 0)
            return false;

        auto c = *t;
        const bool hasExponent = (c == 'e' || c == 'E');

        if (hasExponent)
        {
            c = *++t;
            if (c == '+' || c == '-')  ++t;
            if (! t.isDigit()) return false;
            while ((++t).isDigit()) {}
        }

        if (! (hasExponent || hasPoint))
            return false;

        literalDoubleValue = std::stod (std::string (input.getAddress(), t.getAddress()));
        input = t;
        literalType = parseSuffixForFloatLiteral();
        checkCharacterImmediatelyAfterLiteral();
        return true;
    }